

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O3

bool __thiscall
brynet::net::TcpService::helpAddChannel
          (TcpService *this,PTR channel,string *ip,ENTER_CALLBACK *enterCallback,
          DISCONNECT_CALLBACK *disConnectCallback,DATA_CALLBACK *dataCallback,
          bool forceSameThreadLoop)

{
  mutex *__mutex;
  pointer psVar1;
  pointer pcVar2;
  EventLoop *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  PTR pDVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  int iVar8;
  THREAD_ID_TYPE *pTVar9;
  string *psVar10;
  pointer psVar11;
  bool bVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  shared_ptr<brynet::net::TcpService> shared_this;
  undefined8 local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_120 [2];
  PTR local_110;
  DATA_CALLBACK *local_108;
  DISCONNECT_CALLBACK *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  ulong local_b8;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  function<void_(long)> local_90;
  function<unsigned_long_(long,_const_char_*,_unsigned_long)> local_70;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  local_128 = (element_type *)0x0;
  a_Stack_120[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110 = channel;
  local_108 = dataCallback;
  local_100 = disConnectCallback;
  iVar7 = rand();
  __mutex = &this->mIOLoopGuard;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  psVar11 = (this->mIOLoopDatas).
            super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    if (!forceSameThreadLoop) {
      uVar14 = (ulong)(long)iVar7 % (ulong)((long)psVar1 - (long)psVar11 >> 4);
LAB_00124708:
      local_128 = psVar11[uVar14].
                  super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_120,
                 &psVar11[uVar14].
                  super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      this_01._M_pi = a_Stack_120[0]._M_pi;
      peVar4 = local_128;
      local_128 = (element_type *)0x0;
      a_Stack_120[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<brynet::net::TcpService,void>
                ((__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2> *)&local_158,
                 (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<brynet::net::TcpService>);
      local_d8 = local_c8;
      pcVar2 = (ip->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + ip->_M_string_length);
      local_b8 = uVar14;
      std::
      function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(&local_b0,enterCallback);
      std::function<void_(long)>::function(&local_90,local_100);
      std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
                (&local_70,local_108);
      local_50 = local_158;
      p_Stack_48 = local_150;
      if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_150->_M_use_count = local_150->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_150->_M_use_count = local_150->_M_use_count + 1;
        }
      }
      local_40 = peVar4;
      p_Stack_38 = this_01._M_pi;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        }
      }
      local_138 = (code *)0x0;
      pcStack_130 = (code *)0x0;
      local_148._M_unused._M_object = (void *)0x0;
      local_148._8_8_ = 0;
      psVar10 = (string *)operator_new(0xa8);
      *(string **)psVar10 = psVar10 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar10,local_d8,local_d8 + local_d0);
      *(ulong *)(psVar10 + 0x20) = local_b8;
      std::
      function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)(psVar10 + 0x28),&local_b0);
      std::function<void_(long)>::function((function<void_(long)> *)(psVar10 + 0x48),&local_90);
      std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
                ((function<unsigned_long_(long,_const_char_*,_unsigned_long)> *)(psVar10 + 0x68),
                 &local_70);
      p_Var6 = p_Stack_38;
      p_Var3 = p_Stack_48;
      pDVar5 = local_110;
      p_Stack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined8 *)(psVar10 + 0x88) = local_50;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0x90) = p_Var3;
      local_50 = 0;
      p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)(psVar10 + 0x98) = local_40;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0xa0) = p_Var6;
      local_40 = (element_type *)0x0;
      pcStack_130 = std::
                    _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
                    ::_M_invoke;
      local_138 = std::
                  _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
                  ::_M_manager;
      local_148._M_unused._0_8_ = (undefined8)psVar10;
      DataSocket::setEnterCallback(local_110,(ENTER_CALLBACK *)&local_148);
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)
      ::$_0::~__0((__0 *)&local_d8);
      this_00 = (peVar4->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (peVar4->mEventLoop).
               super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = operator_new(0x18);
      *(EventLoop **)local_f8._M_unused._0_8_ = this_00;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) =
           p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      *(PTR *)((long)local_f8._M_unused._0_8_ + 0x10) = pDVar5;
      pcStack_e0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
                 ::_M_manager;
      EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_f8);
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,__destroy_functor);
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
      }
      bVar12 = true;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      goto LAB_00124a04;
    }
    lVar13 = 0;
    uVar14 = 0;
    do {
      iVar7 = *(int *)(*(long *)(*(long *)((long)&(psVar11->
                                                  super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar13) + 0x10) + 0xbc);
      pTVar9 = CurrentThread::tid();
      if (iVar7 == *pTVar9) {
        psVar11 = (this->mIOLoopDatas).
                  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00124708;
      }
      uVar14 = uVar14 + 1;
      psVar11 = (this->mIOLoopDatas).
                super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < (ulong)((long)(this->mIOLoopDatas).
                                    super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4)
            );
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  bVar12 = false;
LAB_00124a04:
  if (a_Stack_120[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_120[0]._M_pi);
  }
  return bVar12;
}

Assistant:

bool TcpService::helpAddChannel(DataSocket::PTR channel, 
    const std::string& ip, 
    const TcpService::ENTER_CALLBACK& enterCallback, 
    const TcpService::DISCONNECT_CALLBACK& disConnectCallback, 
    const TcpService::DATA_CALLBACK& dataCallback,
    bool forceSameThreadLoop)
{
    std::shared_ptr<IOLoopData> ioLoopData;
    size_t loopIndex = 0;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);

        if (mIOLoopDatas.empty())
        {
            return false;
        }
        
        if (forceSameThreadLoop)
        {
            bool find = false;
            for (size_t i = 0; i < mIOLoopDatas.size(); i++)
            {
                if (mIOLoopDatas[i]->getEventLoop()->isInLoopThread())
                {
                    loopIndex = i;
                    find = true;
                    break;
                }
            }
            if (!find)
            {
                return false;
            }
        }
        else
        {
            loopIndex = randNum % mIOLoopDatas.size();
        }

        ioLoopData = mIOLoopDatas[loopIndex];
    }
    

    const auto& loop = ioLoopData->getEventLoop();
    auto loopDataCapture = std::move(ioLoopData);
    auto shared_this = shared_from_this();
    channel->setEnterCallback([ip, 
        loopIndex, 
        enterCallback, 
        disConnectCallback, 
        dataCallback, 
        shared_this,
        loopDataCapture](DataSocket::PTR dataSocket){
        auto id = shared_this->MakeID(loopIndex, loopDataCapture);
        union SessionId sid;
        sid.id = id;
        loopDataCapture->getDataSockets().set(dataSocket, sid.data.index);
        dataSocket->setUD(id);
        dataSocket->setDataCallback([dataCallback, 
            id](DataSocket::PTR ds, const char* buffer, size_t len){
            return dataCallback(id, buffer, len);
        });

        dataSocket->setDisConnectCallback([disConnectCallback, 
            id, 
            shared_this](DataSocket::PTR arg){
            shared_this->procDataSocketClose(arg);
            disConnectCallback(id);
            delete arg;
        });

        if (enterCallback != nullptr)
        {
            enterCallback(id, ip);
        }
    });

    //TODO::����channel �ڴ�����ȫ�ķ�ʽ
    loop->pushAsyncProc([loop, channel](){
        if (!channel->onEnterEventLoop(std::move(loop)))
        {
            delete channel;
        }
    });

    return true;
}